

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::read_sof_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  int local_14;
  uint num_left;
  int i;
  jpeg_decoder *this_local;
  
  uVar1 = get_bits(this,0x10);
  uVar2 = get_bits(this,8);
  if (uVar2 != 8) {
    stop_decoding(this,JPGD_BAD_PRECISION);
  }
  uVar2 = get_bits(this,0x10);
  this->m_image_y_size = uVar2;
  if ((this->m_image_y_size < 1) || (0x8000 < this->m_image_y_size)) {
    stop_decoding(this,JPGD_BAD_HEIGHT);
  }
  uVar2 = get_bits(this,0x10);
  this->m_image_x_size = uVar2;
  if ((this->m_image_x_size < 1) || (0x8000 < this->m_image_x_size)) {
    stop_decoding(this,JPGD_BAD_WIDTH);
  }
  uVar2 = get_bits(this,8);
  this->m_comps_in_frame = uVar2;
  if (4 < this->m_comps_in_frame) {
    stop_decoding(this,JPGD_TOO_MANY_COMPONENTS);
  }
  if (uVar1 != this->m_comps_in_frame * 3 + 8U) {
    stop_decoding(this,JPGD_BAD_SOF_LENGTH);
  }
  local_14 = 0;
  while( true ) {
    if (this->m_comps_in_frame <= local_14) {
      return;
    }
    uVar1 = get_bits(this,8);
    this->m_comp_ident[local_14] = uVar1;
    uVar1 = get_bits(this,4);
    this->m_comp_h_samp[local_14] = uVar1;
    uVar1 = get_bits(this,4);
    this->m_comp_v_samp[local_14] = uVar1;
    if ((((this->m_comp_h_samp[local_14] == 0) || (this->m_comp_v_samp[local_14] == 0)) ||
        (2 < this->m_comp_h_samp[local_14])) || (2 < this->m_comp_v_samp[local_14])) break;
    uVar1 = get_bits(this,8);
    this->m_comp_quant[local_14] = uVar1;
    if (3 < this->m_comp_quant[local_14]) {
      stop_decoding(this,JPGD_DECODE_ERROR);
    }
    local_14 = local_14 + 1;
  }
  stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
}

Assistant:

void jpeg_decoder::read_sof_marker()
	{
		int i;
		uint num_left;

		num_left = get_bits(16);

		/* precision: sorry, only 8-bit precision is supported */
		if (get_bits(8) != 8)
			stop_decoding(JPGD_BAD_PRECISION);

		m_image_y_size = get_bits(16);

		if ((m_image_y_size < 1) || (m_image_y_size > JPGD_MAX_HEIGHT))
			stop_decoding(JPGD_BAD_HEIGHT);

		m_image_x_size = get_bits(16);

		if ((m_image_x_size < 1) || (m_image_x_size > JPGD_MAX_WIDTH))
			stop_decoding(JPGD_BAD_WIDTH);

		m_comps_in_frame = get_bits(8);

		if (m_comps_in_frame > JPGD_MAX_COMPONENTS)
			stop_decoding(JPGD_TOO_MANY_COMPONENTS);

		if (num_left != (uint)(m_comps_in_frame * 3 + 8))
			stop_decoding(JPGD_BAD_SOF_LENGTH);

		for (i = 0; i < m_comps_in_frame; i++)
		{
			m_comp_ident[i] = get_bits(8);
			m_comp_h_samp[i] = get_bits(4);
			m_comp_v_samp[i] = get_bits(4);

			if (!m_comp_h_samp[i] || !m_comp_v_samp[i] || (m_comp_h_samp[i] > 2) || (m_comp_v_samp[i] > 2))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			m_comp_quant[i] = get_bits(8);
			if (m_comp_quant[i] >= JPGD_MAX_QUANT_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);
		}
	}